

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPStateImp.cpp
# Opt level: O1

void __thiscall TSPStateImp::InitData(TSPStateImp *this)

{
  int *piVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  piVar1 = &this->n;
  std::istream::operator>>((istream *)&std::cin,piVar1);
  uVar6 = 0xffffffffffffffff;
  if (-1 < (long)this->n) {
    uVar6 = (long)this->n * 8;
  }
  pdVar2 = (double *)operator_new__(uVar6);
  this->x = pdVar2;
  pdVar2 = (double *)operator_new__(uVar6);
  this->y = pdVar2;
  if (0 < this->n) {
    lVar4 = 0;
    do {
      std::istream::_M_extract<double>((double *)&std::cin);
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->n);
  }
  iVar3 = *piVar1;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      std::istream::_M_extract<double>((double *)&std::cin);
      lVar4 = lVar4 + 1;
      iVar3 = this->n;
    } while (lVar4 < iVar3);
  }
  pdVar2 = (double *)operator_new__((ulong)(uint)(iVar3 * iVar3) << 3);
  this->adjacencyMatrix = pdVar2;
  if (0 < this->n) {
    lVar4 = 0;
    do {
      if (0 < *piVar1) {
        lVar5 = 0;
        do {
          dVar7 = this->x[lVar4] - this->x[lVar5];
          dVar8 = this->y[lVar4] - this->y[lVar5];
          dVar7 = dVar7 * dVar7 + dVar8 * dVar8;
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          this->adjacencyMatrix[(long)this->n * (long)(int)lVar4 + lVar5] = dVar7;
          lVar5 = lVar5 + 1;
        } while (lVar5 < this->n);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < *piVar1);
  }
  return;
}

Assistant:

void TSPStateImp::InitData()
{
	std::cin >> n;
	x = new double[n];
	y = new double[n];

	for (int i = 0; i < n; ++i)
		std::cin >> x[i];

	for (int j = 0; j < n; ++j)
		std::cin >> y[j];

	adjacencyMatrix = new double[n * n];

	for (int i = 0; i < n; ++i)
		for (int j = 0; j < n; ++j)
			adjacencyMatrix[i * n + j] = sqrt((x[i] - x[j]) * (x[i] - x[j]) + (y[i] - y[j]) * (y[i] - y[j]));
}